

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

SequenceReset *
anon_unknown.dwarf_52c65e::createT11SequenceReset
          (SequenceReset *__return_storage_ptr__,char *sender,char *target,int seq,int newSeq)

{
  undefined1 *this;
  int iVar1;
  SequenceReset *extraout_RAX;
  FieldBase local_68;
  
  FIXT11::SequenceReset::SequenceReset(__return_storage_ptr__);
  FIX::UInt64Field::UInt64Field((UInt64Field *)&local_68,0x24,0xb);
  local_68._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003277f8;
  FIX::FieldMap::setField((FieldMap *)__return_storage_ptr__,&local_68,true);
  FIX::FieldBase::~FieldBase(&local_68);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,"ISLD","TW",5);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)&local_68,9,iVar1);
  local_68._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)this,&local_68,true);
  FIX::FieldBase::~FieldBase(&local_68);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)&local_68,10,iVar1);
  local_68._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325560;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_68,true);
  FIX::FieldBase::~FieldBase(&local_68);
  return extraout_RAX;
}

Assistant:

FIXT11::SequenceReset createT11SequenceReset(const char *sender, const char *target, int seq, int newSeq) {
  FIXT11::SequenceReset sequenceReset;
  sequenceReset.set(NewSeqNo(newSeq));
  fillHeader(sequenceReset.getHeader(), sender, target, seq);
  sequenceReset.getHeader().setField(BodyLength(sequenceReset.bodyLength()));
  sequenceReset.getTrailer().setField(CheckSum(sequenceReset.checkSum()));
  return sequenceReset;
}